

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AttributeSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeSpecSyntax,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
          (BumpAllocator *this,Token *args,EqualsValueClauseSyntax **args_1)

{
  EqualsValueClauseSyntax *pEVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  AttributeSpecSyntax *pAVar7;
  
  pAVar7 = (AttributeSpecSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeSpecSyntax *)this->endPtr < pAVar7 + 1) {
    pAVar7 = (AttributeSpecSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pAVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pEVar1 = *args_1;
  (pAVar7->super_SyntaxNode).kind = AttributeSpec;
  (pAVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pAVar7->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pAVar7->name).kind = TVar3;
  (pAVar7->name).field_0x2 = uVar4;
  (pAVar7->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pAVar7->name).rawLen = uVar6;
  (pAVar7->name).info = pIVar2;
  pAVar7->value = pEVar1;
  if (pEVar1 != (EqualsValueClauseSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = &pAVar7->super_SyntaxNode;
  }
  return pAVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }